

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loslib.c
# Opt level: O2

void setfield(lua_State *L,char *key,int value)

{
  lua_pushinteger(L,(long)value);
  lua_setfield(L,-2,key);
  return;
}

Assistant:

static void setfield (lua_State *L, const char *key, int value, int delta) {
  #if (defined(LUA_NUMTIME) && LUA_MAXINTEGER <= INT_MAX)
    if (value > LUA_MAXINTEGER - delta)
      luaL_error(L, "field '%s' is out-of-bound", key);
  #endif
  lua_pushinteger(L, (lua_Integer)value + delta);
  lua_setfield(L, -2, key);
}